

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_source_seek_to_second(ma_data_source *pDataSource,float seekPointInSeconds)

{
  ulong uVar1;
  size_t in_RDI;
  float in_XMM0_Da;
  ma_result result;
  ma_uint32 sampleRate;
  ma_uint64 frameIndex;
  undefined4 in_stack_00000010;
  undefined4 local_24;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ma_result mVar2;
  
  if (in_RDI == 0) {
    mVar2 = MA_INVALID_ARGS;
  }
  else {
    mVar2 = ma_data_source_get_data_format
                      (pDataSource,(ma_format *)CONCAT44(seekPointInSeconds,in_stack_00000010),
                       (ma_uint32 *)frameIndex,_result,
                       (ma_channel *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI);
    if (mVar2 == MA_SUCCESS) {
      uVar1 = (ulong)(in_XMM0_Da * (float)local_24);
      mVar2 = ma_data_source_seek_to_pcm_frame
                        ((ma_data_source *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),
                         uVar1 | (long)(in_XMM0_Da * (float)local_24 - 9.223372e+18) &
                                 (long)uVar1 >> 0x3f);
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_data_source_seek_to_second(ma_data_source* pDataSource, float seekPointInSeconds)
{
    ma_uint64 frameIndex;
    ma_uint32 sampleRate;
    ma_result result;

    if (pDataSource == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* We need PCM frames instead of seconds */
    frameIndex = (ma_uint64)(seekPointInSeconds * sampleRate);

    return ma_data_source_seek_to_pcm_frame(pDataSource, frameIndex);
}